

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::OP_ApplyArgs<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (InterpreterStackFrame *this,
          OpLayoutT_Reg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  undefined1 uVar1;
  long lVar2;
  CallInfo callInfo;
  Var func;
  Var instance;
  
  lVar2 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  uVar1 = *(undefined1 *)(lVar2 + 0x1570);
  callInfo = *(CallInfo *)(this + (ulong)playout->R4 * 8 + 0x160);
  func = GetReg<unsigned_int>(this,playout->R1);
  instance = GetReg<unsigned_int>(this,playout->R2);
  JavascriptOperators::OP_ApplyArgs
            (func,instance,*(void ***)(this + (ulong)playout->R3 * 8 + 0x160),callInfo,
             *(ScriptContext **)(this + 0x78));
  *(undefined1 *)(lVar2 + 0x1570) = uVar1;
  return;
}

Assistant:

void InterpreterStackFrame::OP_ApplyArgs(const unaligned OpLayoutT_Reg5<T> * playout)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        // Currently ApplyArgs is equivalent to CallFldVoid (where we don't use the return value)
        Var v = GetNonVarReg(playout->R4);
        JavascriptOperators::OP_ApplyArgs(GetReg(playout->R1), GetReg(playout->R2),
            (void**)GetNonVarReg(playout->R3), *((CallInfo*)&v), GetScriptContext());
        threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
    }